

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void R_DrawTiltedPlane(visplane_t *pl,double _xscale,double _yscale,fixed_t alpha,bool additive,
                      bool masked)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  lighttable_t *plVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  double __x;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  dVar10 = ViewPos.Y;
  dVar9 = ViewPos.X;
  if (alpha < 1) {
    return;
  }
  fVar1 = R_DrawTiltedPlane::ifloatpow2[ds_xbits];
  fVar2 = R_DrawTiltedPlane::ifloatpow2[ds_ybits];
  dVar7 = 64.0 / ((double)fVar1 * _xscale);
  dVar21 = 64.0 / ((double)fVar2 * _yscale);
  dVar3 = (pl->height).D;
  dVar4 = (pl->height).normal.X;
  dVar5 = (pl->height).normal.Y;
  dVar6 = (pl->height).negiC;
  pviewx = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_xbits & 0x1fU)) +
                 (pl->xform).xScale * (pl->xform).xOffs,0);
  pviewy = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_ybits & 0x1fU)) +
                 (pl->xform).yScale * (pl->xform).yOffs,0);
  dVar8 = (dVar5 * ViewPos.Y + dVar4 * ViewPos.X + dVar3) * dVar6;
  __x = ((pl->xform).Angle.Degrees + (pl->xform).baseAngle.Degrees) * 0.017453292519943295;
  dVar22 = ViewAngle.Degrees * 0.017453292519943295;
  sincos(4.71238898038469 - dVar22,&local_28,&local_30);
  dVar11 = ViewPos.Z;
  fVar23 = (float)(local_30 * dVar9 - local_28 * dVar10);
  fVar15 = (float)(local_30 * dVar10 + local_28 * dVar9);
  fVar16 = (float)(dVar6 * dVar3 - ViewPos.Z);
  sincos(3.141592653589793 - (dVar22 + __x),&local_48,&local_50);
  fVar19 = (float)(local_50 * dVar21);
  fVar20 = (float)(local_48 * dVar21);
  fVar17 = (float)(local_48 * dVar7);
  fVar18 = (float)(-dVar7 * local_50);
  sincos(__x,&local_38,&local_40);
  fVar25 = (float)(((dVar21 * local_40 + dVar10) * dVar5 +
                   (local_38 * dVar21 + dVar9) * dVar4 + dVar3) * dVar6 - dVar8);
  fVar24 = (float)((((local_40 * dVar7 - dVar9) * dVar4 - dVar3) -
                   (dVar7 * local_38 + dVar10) * dVar5) * dVar6 + dVar8);
  plane_sz.X = fVar25 * fVar18 - fVar24 * fVar20;
  plane_sz.Z = (float)((double)(fVar24 * fVar19 - fVar25 * fVar17) * FocalLengthX);
  plane_sz.Y = (float)((double)(fVar20 * fVar17 - fVar18 * fVar19) * IYaspectMul);
  plane_su.X = (fVar20 * fVar16 - fVar25 * fVar15) * 4.2949673e+09;
  plane_su.Y = (float)((double)(fVar19 * fVar15 - fVar23 * fVar20) * IYaspectMul) * 4.2949673e+09;
  plane_su.Z = (float)((double)(fVar25 * fVar23 - fVar19 * fVar16) * FocalLengthX) * 4.2949673e+09;
  plane_sv.X = (fVar18 * fVar16 - fVar24 * fVar15) * 4.2949673e+09;
  plane_sv.Y = (float)((double)(fVar15 * fVar17 - fVar23 * fVar18) * IYaspectMul) * 4.2949673e+09;
  plane_sv.Z = (float)((double)(fVar24 * fVar23 - fVar16 * fVar17) * FocalLengthX) * 4.2949673e+09;
  if (((byte)MirrorFlags & 1) != 0) {
    plane_su.X = -plane_su.X;
    plane_sv.X = -plane_sv.X;
    plane_sz.X = -plane_sz.X;
  }
  planelightfloat =
       (float)(((double)fVar2 * _yscale * (double)r_TiltVisibility *
               (double)fVar1 * _xscale * 1.52587890625e-05) / ABS(dVar8 - dVar11));
  if (0.0 < (pl->height).normal.Z) {
    planelightfloat = -planelightfloat;
  }
  if ((long)fixedlightlev < 0) {
    plVar12 = fixedcolormap;
    if (fixedcolormap == (lighttable_t *)0x0) {
      plVar12 = basecolormap->Maps;
      plane_shade = true;
      goto LAB_0030b40a;
    }
  }
  else {
    plVar12 = basecolormap->Maps + fixedlightlev;
  }
  plane_shade = false;
LAB_0030b40a:
  ds_colormap = plVar12;
  if ((plane_shade == false) && (lVar13 = (long)viewwidth, 0 < lVar13)) {
    lVar14 = 0;
    do {
      *(lighttable_t **)((long)tiltlighting + lVar14) = plVar12;
      lVar14 = lVar14 + 8;
    } while (lVar13 * 8 != lVar14);
  }
  R_MapVisPlane(pl,R_MapTiltedPlane);
  return;
}

Assistant:

void R_DrawTiltedPlane (visplane_t *pl, double _xscale, double _yscale, fixed_t alpha, bool additive, bool masked)
{
	static const float ifloatpow2[16] =
	{
		// ifloatpow2[i] = 1 / (1 << i)
		64.f, 32.f, 16.f, 8.f, 4.f, 2.f, 1.f, 0.5f,
		0.25f, 0.125f, 0.0625f, 0.03125f, 0.015625f, 0.0078125f,
		0.00390625f, 0.001953125f
		/*, 0.0009765625f, 0.00048828125f, 0.000244140625f,
		1.220703125e-4f, 6.103515625e-5, 3.0517578125e-5*/
	};
	double lxscale, lyscale;
	double xscale, yscale;
	FVector3 p, m, n;
	double ang, planeang, cosine, sine;
	double zeroheight;

	if (alpha <= 0)
	{
		return;
	}

	lxscale = _xscale * ifloatpow2[ds_xbits];
	lyscale = _yscale * ifloatpow2[ds_ybits];
	xscale = 64.f / lxscale;
	yscale = 64.f / lyscale;
	zeroheight = pl->height.ZatPoint(ViewPos);

	pviewx = xs_ToFixed(32 - ds_xbits, pl->xform.xOffs * pl->xform.xScale);
	pviewy = xs_ToFixed(32 - ds_ybits, pl->xform.yOffs * pl->xform.yScale);
	planeang = (pl->xform.Angle + pl->xform.baseAngle).Radians();

	// p is the texture origin in view space
	// Don't add in the offsets at this stage, because doing so can result in
	// errors if the flat is rotated.
	ang = M_PI*3/2 - ViewAngle.Radians();
	cosine = cos(ang), sine = sin(ang);
	p[0] = ViewPos.X * cosine - ViewPos.Y * sine;
	p[2] = ViewPos.X * sine + ViewPos.Y * cosine;
	p[1] = pl->height.ZatPoint(0.0, 0.0) - ViewPos.Z;

	// m is the v direction vector in view space
	ang = ang - M_PI / 2 - planeang;
	cosine = cos(ang), sine = sin(ang);
	m[0] = yscale * cosine;
	m[2] = yscale * sine;
//	m[1] = pl->height.ZatPointF (0, iyscale) - pl->height.ZatPointF (0,0));
//	VectorScale2 (m, 64.f/VectorLength(m));

	// n is the u direction vector in view space
#if 0
	//let's use the sin/cosine we already know instead of computing new ones
	ang += M_PI/2
	n[0] = -xscale * cos(ang);
	n[2] = -xscale * sin(ang);
#else
	n[0] = xscale * sine;
	n[2] = -xscale * cosine;
#endif
//	n[1] = pl->height.ZatPointF (ixscale, 0) - pl->height.ZatPointF (0,0));
//	VectorScale2 (n, 64.f/VectorLength(n));

	// This code keeps the texture coordinates constant across the x,y plane no matter
	// how much you slope the surface. Use the commented-out code above instead to keep
	// the textures a constant size across the surface's plane instead.
	cosine = cos(planeang), sine = sin(planeang);
	m[1] = pl->height.ZatPoint(ViewPos.X + yscale * sine, ViewPos.Y + yscale * cosine) - zeroheight;
	n[1] = -(pl->height.ZatPoint(ViewPos.X - xscale * cosine, ViewPos.Y + xscale * sine) - zeroheight);

	plane_su = p ^ m;
	plane_sv = p ^ n;
	plane_sz = m ^ n;

	plane_su.Z *= FocalLengthX;
	plane_sv.Z *= FocalLengthX;
	plane_sz.Z *= FocalLengthX;

	plane_su.Y *= IYaspectMul;
	plane_sv.Y *= IYaspectMul;
	plane_sz.Y *= IYaspectMul;

	// Premultiply the texture vectors with the scale factors
	plane_su *= 4294967296.f;
	plane_sv *= 4294967296.f;

	if (MirrorFlags & RF_XFLIP)
	{
		plane_su[0] = -plane_su[0];
		plane_sv[0] = -plane_sv[0];
		plane_sz[0] = -plane_sz[0];
	}

	planelightfloat = (r_TiltVisibility * lxscale * lyscale) / (fabs(pl->height.ZatPoint(ViewPos) - ViewPos.Z)) / 65536.f;

	if (pl->height.fC() > 0)
		planelightfloat = -planelightfloat;

	if (fixedlightlev >= 0)
		ds_colormap = basecolormap->Maps + fixedlightlev, plane_shade = false;
	else if (fixedcolormap)
		ds_colormap = fixedcolormap, plane_shade = false;
	else
		ds_colormap = basecolormap->Maps, plane_shade = true;

	if (!plane_shade)
	{
		for (int i = 0; i < viewwidth; ++i)
		{
			tiltlighting[i] = ds_colormap;
		}
	}

#if defined(X86_ASM)
	if (ds_source != ds_curtiltedsource)
		R_SetTiltedSpanSource_ASM (ds_source);
	R_MapVisPlane (pl, R_DrawTiltedPlane_ASM);
#else
	R_MapVisPlane (pl, R_MapTiltedPlane);
#endif
}